

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O0

void run_ixor_test(void)

{
  int iVar1;
  int iVar2;
  array_container_t *paVar3;
  bitset_container_t *pbVar4;
  bitset_container_t *bitset;
  bitset_container_t *bitset_00;
  bitset_container_t *bitset_01;
  array_container_t *src_1;
  int card_3_4;
  int ret_type;
  array_container_t *temp_a;
  bitset_container_t *temp_b;
  run_container_t *temp_r;
  container_t *C;
  int cx12;
  int x_4;
  int randstate;
  int x_3;
  int x_2;
  int x_1;
  int x;
  run_container_t *R4;
  run_container_t *R3;
  run_container_t *R2;
  run_container_t *R1;
  bitset_container_t *BX;
  bitset_container_t *B3;
  bitset_container_t *B2;
  bitset_container_t *B1;
  array_container_t *AX;
  array_container_t *A4;
  array_container_t *A3;
  array_container_t *A2;
  array_container_t *A1;
  undefined4 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  uint16_t in_stack_fffffffffffffefe;
  array_container_t *in_stack_ffffffffffffff00;
  array_container_t *in_stack_ffffffffffffff08;
  array_container_t *in_stack_ffffffffffffff10;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  
  array_container_create();
  array_container_create();
  array_container_create();
  array_container_create();
  paVar3 = array_container_create();
  pbVar4 = bitset_container_create();
  bitset = bitset_container_create();
  bitset_00 = bitset_container_create();
  bitset_01 = bitset_container_create();
  run_container_create();
  run_container_create();
  run_container_create();
  run_container_create();
  for (local_6c = 0; local_6c < 0x10000; local_6c = local_6c + 1) {
    if (local_6c % 5 < 3) {
      array_container_add(in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
      bitset_container_set(pbVar4,(uint16_t)local_6c);
      run_container_add((run_container_t *)in_stack_ffffffffffffff08,
                        (uint16_t)((ulong)in_stack_ffffffffffffff00 >> 0x30));
    }
  }
  for (local_70 = 0; local_70 < 0x10000; local_70 = local_70 + 1) {
    if (local_70 % 0x3e < 0x25) {
      array_container_add(in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
      bitset_container_set(bitset,(uint16_t)local_70);
      run_container_add((run_container_t *)in_stack_ffffffffffffff08,
                        (uint16_t)((ulong)in_stack_ffffffffffffff00 >> 0x30));
    }
  }
  for (local_74 = 0; local_74 < 0x10000; local_74 = local_74 + 1) {
    if (local_74 % 0x3e < 0x25 != local_74 % 5 < 3) {
      array_container_add(in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
      bitset_container_set(bitset_01,(uint16_t)local_74);
    }
  }
  for (local_78 = 0; local_78 < 0x10000; local_78 = local_78 + 1) {
    if ((local_78 % 5 < 2) || ((local_78 % 5 < 3 && (10000 < local_78)))) {
      array_container_add(in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
      bitset_container_set(bitset_00,(uint16_t)local_78);
      run_container_add((run_container_t *)in_stack_ffffffffffffff08,
                        (uint16_t)((ulong)in_stack_ffffffffffffff00 >> 0x30));
    }
  }
  local_7c = 1;
  for (local_80 = 0; local_80 < 0x10000; local_80 = local_80 + 1) {
    if (local_7c % 4 != 0) {
      run_container_add((run_container_t *)in_stack_ffffffffffffff08,
                        (uint16_t)((ulong)in_stack_ffffffffffffff00 >> 0x30));
      array_container_add(in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
    }
    local_7c = (local_7c * 0xd68 + 0x1a85) % 0x26f5;
  }
  iVar1 = array_container_cardinality(paVar3);
  run_container_clone((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffefe,
                               CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  run_bitset_container_ixor
            ((run_container_t *)in_stack_ffffffffffffff10,
             (bitset_container_t *)in_stack_ffffffffffffff08,
             (container_t **)in_stack_ffffffffffffff00);
  _assert_true((unsigned_long)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
               (char *)in_stack_ffffffffffffff00,
               CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_free((array_container_t *)0x10520e);
  bitset_container_create();
  bitset_container_copy
            ((bitset_container_t *)in_stack_ffffffffffffff00,
             (bitset_container_t *)
             CONCAT26(in_stack_fffffffffffffefe,
                      CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  bitset_run_container_ixor
            ((bitset_container_t *)in_stack_ffffffffffffff10,
             (run_container_t *)in_stack_ffffffffffffff08,(container_t **)in_stack_ffffffffffffff00)
  ;
  _assert_true((unsigned_long)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
               (char *)in_stack_ffffffffffffff00,
               CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_free((array_container_t *)0x105298);
  array_container_clone
            ((array_container_t *)
             CONCAT26(in_stack_fffffffffffffefe,
                      CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  array_run_container_ixor
            (in_stack_ffffffffffffff10,(run_container_t *)in_stack_ffffffffffffff08,
             (container_t **)in_stack_ffffffffffffff00);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_free((array_container_t *)0x10530f);
  run_container_clone((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffefe,
                               CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  run_array_container_ixor
            ((run_container_t *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (container_t **)in_stack_ffffffffffffff00);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_free((array_container_t *)0x105386);
  run_container_clone((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffefe,
                               CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  iVar2 = run_run_container_ixor
                    ((run_container_t *)in_stack_ffffffffffffff10,
                     (run_container_t *)in_stack_ffffffffffffff08,
                     (container_t **)in_stack_ffffffffffffff00);
  _assert_int_not_equal
            ((unsigned_long)in_stack_ffffffffffffff10,(unsigned_long)in_stack_ffffffffffffff08,
             (char *)in_stack_ffffffffffffff00,
             CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  if (iVar2 == 3) {
    run_container_cardinality
              ((run_container_t *)
               CONCAT26(in_stack_fffffffffffffefe,
                        CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
    _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                      (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                      CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
    run_container_free((run_container_t *)0x10540a);
  }
  else {
    array_container_cardinality((array_container_t *)0x0);
    _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                      (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                      CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
    array_container_free((array_container_t *)0x105438);
  }
  run_container_clone((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffefe,
                               CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  run_bitset_container_ixor
            ((run_container_t *)in_stack_ffffffffffffff10,
             (bitset_container_t *)in_stack_ffffffffffffff08,
             (container_t **)in_stack_ffffffffffffff00);
  _assert_true((unsigned_long)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
               (char *)in_stack_ffffffffffffff00,
               CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_free((array_container_t *)0x1054b9);
  array_container_clone
            ((array_container_t *)
             CONCAT26(in_stack_fffffffffffffefe,
                      CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  array_run_container_ixor
            (in_stack_ffffffffffffff10,(run_container_t *)in_stack_ffffffffffffff08,
             (container_t **)in_stack_ffffffffffffff00);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_free((array_container_t *)0x105531);
  bitset_container_create();
  bitset_container_copy
            ((bitset_container_t *)in_stack_ffffffffffffff00,
             (bitset_container_t *)
             CONCAT26(in_stack_fffffffffffffefe,
                      CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  bitset_run_container_ixor
            ((bitset_container_t *)in_stack_ffffffffffffff10,
             (run_container_t *)in_stack_ffffffffffffff08,(container_t **)in_stack_ffffffffffffff00)
  ;
  _assert_true((unsigned_long)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
               (char *)in_stack_ffffffffffffff00,
               CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_free((array_container_t *)0x1055bc);
  run_container_clone((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffefe,
                               CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  run_array_container_ixor
            ((run_container_t *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (container_t **)in_stack_ffffffffffffff00);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_free((array_container_t *)0x105634);
  run_container_clone((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffefe,
                               CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  run_run_container_ixor
            ((run_container_t *)in_stack_ffffffffffffff10,
             (run_container_t *)in_stack_ffffffffffffff08,(container_t **)in_stack_ffffffffffffff00)
  ;
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  array_container_free((array_container_t *)0x1056ac);
  run_container_clone((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffefe,
                               CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  run_bitset_container_ixor
            ((run_container_t *)in_stack_ffffffffffffff10,
             (bitset_container_t *)in_stack_ffffffffffffff08,
             (container_t **)in_stack_ffffffffffffff00);
  _assert_true((unsigned_long)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
               (char *)in_stack_ffffffffffffff00,
               CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  pbVar4 = (bitset_container_t *)(long)iVar1;
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_free((bitset_container_t *)0x105737);
  array_container_clone
            ((array_container_t *)
             CONCAT26(in_stack_fffffffffffffefe,
                      CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  array_run_container_ixor
            (in_stack_ffffffffffffff10,(run_container_t *)in_stack_ffffffffffffff08,
             (container_t **)pbVar4);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,
                    (unsigned_long)in_stack_ffffffffffffff08,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  paVar3 = (array_container_t *)(long)iVar1;
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff10,(unsigned_long)paVar3,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_free((bitset_container_t *)0x1057bc);
  bitset_container_create();
  bitset_container_copy
            (pbVar4,(bitset_container_t *)
                    CONCAT26(in_stack_fffffffffffffefe,
                             CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  bitset_run_container_ixor
            ((bitset_container_t *)in_stack_ffffffffffffff10,(run_container_t *)paVar3,
             (container_t **)pbVar4);
  _assert_true((unsigned_long)in_stack_ffffffffffffff10,(char *)paVar3,(char *)pbVar4,
               CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  src_1 = (array_container_t *)(long)iVar1;
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)paVar3,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_free((bitset_container_t *)0x105851);
  run_container_clone((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffefe,
                               CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  run_array_container_ixor((run_container_t *)src_1,paVar3,(container_t **)pbVar4);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)paVar3,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)paVar3,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_free((bitset_container_t *)0x1058d6);
  run_container_clone((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffefe,
                               CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  run_run_container_ixor((run_container_t *)src_1,(run_container_t *)paVar3,(container_t **)pbVar4);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)paVar3,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)paVar3,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_free((bitset_container_t *)0x10595b);
  run_container_clone((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffefe,
                               CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  run_bitset_container_ixor
            ((run_container_t *)src_1,(bitset_container_t *)paVar3,(container_t **)pbVar4);
  _assert_true((unsigned_long)src_1,(char *)paVar3,(char *)pbVar4,
               CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_cardinality((bitset_container_t *)0x0);
  bitset_container_free((bitset_container_t *)0x1059c4);
  array_container_clone
            ((array_container_t *)
             CONCAT26(in_stack_fffffffffffffefe,
                      CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  array_run_container_ixor(src_1,(run_container_t *)paVar3,(container_t **)pbVar4);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)paVar3,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)paVar3,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_free((bitset_container_t *)0x105a46);
  bitset_container_create();
  bitset_container_copy
            (pbVar4,(bitset_container_t *)
                    CONCAT26(in_stack_fffffffffffffefe,
                             CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  bitset_run_container_ixor
            ((bitset_container_t *)src_1,(run_container_t *)paVar3,(container_t **)pbVar4);
  _assert_true((unsigned_long)src_1,(char *)paVar3,(char *)pbVar4,
               CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)paVar3,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_free((bitset_container_t *)0x105ad8);
  run_container_clone((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffefe,
                               CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  run_array_container_ixor((run_container_t *)src_1,paVar3,(container_t **)pbVar4);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)paVar3,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)paVar3,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_free((bitset_container_t *)0x105b5a);
  run_container_clone((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffefe,
                               CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  run_run_container_ixor((run_container_t *)src_1,(run_container_t *)paVar3,(container_t **)pbVar4);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)paVar3,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)paVar3,(char *)pbVar4,
                    CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
  bitset_container_free((bitset_container_t *)0x105bdc);
  array_container_free((array_container_t *)0x105bf2);
  array_container_free((array_container_t *)0x105bff);
  array_container_free((array_container_t *)0x105c0c);
  array_container_free((array_container_t *)0x105c19);
  array_container_free((array_container_t *)0x105c26);
  bitset_container_free((bitset_container_t *)0x105c33);
  bitset_container_free((bitset_container_t *)0x105c40);
  bitset_container_free((bitset_container_t *)0x105c4d);
  bitset_container_free((bitset_container_t *)0x105c5a);
  run_container_free((run_container_t *)0x105c67);
  run_container_free((run_container_t *)0x105c74);
  run_container_free((run_container_t *)0x105c81);
  run_container_free((run_container_t *)0x105c8e);
  return;
}

Assistant:

DEFINE_TEST(run_ixor_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* A3 = array_container_create();
    array_container_t* A4 = array_container_create();
    array_container_t* AX = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* B3 = bitset_container_create();
    bitset_container_t* BX = bitset_container_create();
    run_container_t* R1 = run_container_create();
    run_container_t* R2 = run_container_create();
    run_container_t* R3 = run_container_create();
    run_container_t* R4 = run_container_create();

    // B/A1 xor R1 is empty (array or run, I guess)
    // B/A1 xor R2 is probably best left as runs
    // B/A3 xor R1 is best as an array.
    // B/A3 xor R4 is best as a bitmap

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x++) {
        if (x % 5 < 3) {
            array_container_add(A1, x);
            bitset_container_set(B1, x);
            run_container_add(R1, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 62 < 37) {
            array_container_add(A2, x);
            bitset_container_set(B2, x);
            run_container_add(R2, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 62 < 37) ^ (x % 5 < 3)) {
            array_container_add(AX, x);
            bitset_container_set(BX, x);
        }

    // the elements x%5 == 2 differ for less than 10k, otherwise same)
    for (int x = 0; x < (1 << 16); x++) {
        if ((x % 5 < 2) || ((x % 5 < 3) && (x > 10000))) {
            array_container_add(A3, x);
            bitset_container_set(B3, x);
            run_container_add(R3, x);
        }
    }

    int randstate = 1;  // for Oakenfull RNG, hope LSBits are nice
    for (int x = 0; x < (1 << 16); x++) {
        if (randstate % 4) {
            run_container_add(R4, x);
            array_container_add(A4, x);
        }
        randstate = (3432 * randstate + 6789) % 9973;
    }

    int cx12 = array_container_cardinality(AX);  // expected xor for ?1 and ?2

    container_t* C = NULL;

    run_container_t* temp_r = run_container_clone(R1);
    assert_false(run_bitset_container_ixor(temp_r, B1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    bitset_container_t* temp_b = bitset_container_create();
    bitset_container_copy(B1, temp_b);
    assert_false(bitset_run_container_ixor(temp_b, R1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    array_container_t* temp_a = array_container_clone(A1);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    // both run coding and array coding have same serialized size for
    // empty
    temp_r = run_container_clone(R1);
    int ret_type = run_run_container_ixor(temp_r, R1, &C);
    assert_int_not_equal(BITSET_CONTAINER_TYPE, ret_type);
    if (ret_type == RUN_CONTAINER_TYPE) {
        assert_int_equal(0, run_container_cardinality(CAST_run(C)));
        run_container_free(CAST_run(C));
    } else {
        assert_int_equal(0, array_container_cardinality(CAST_array(C)));
        array_container_free(CAST_array(C));
    }
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_false(run_bitset_container_ixor(temp_r, B3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_a = array_container_clone(A3);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R1, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_b = bitset_container_create();
    bitset_container_copy(B1, temp_b);
    assert_false(bitset_run_container_ixor(temp_b, R3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R3);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A1, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_run_container_ixor(temp_r, R3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_true(run_bitset_container_ixor(temp_r, B2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_a = array_container_clone(A2);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R1, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_b = bitset_container_create();
    bitset_container_copy(B1, temp_b);
    assert_true(bitset_run_container_ixor(temp_b, R2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_ixor(temp_r, R2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R4);
    assert_true(run_bitset_container_ixor(temp_r, B3, &C));
    int card_3_4 = bitset_container_cardinality(CAST_bitset(C));
    // assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_a = array_container_clone(A3);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R4, &C));
    // if this fails, either this bitset is wrong or the previous one...
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_b = bitset_container_create();
    bitset_container_copy(B3, temp_b);
    assert_true(bitset_run_container_ixor(temp_b, R4, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R3);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A4, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R4);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_ixor(temp_r, R3, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    array_container_free(A1);
    array_container_free(A2);
    array_container_free(A3);
    array_container_free(AX);
    array_container_free(A4);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(B3);
    bitset_container_free(BX);

    run_container_free(R1);
    run_container_free(R2);
    run_container_free(R3);
    run_container_free(R4);
}